

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

void __thiscall pbrt::Tensor::Tensor(Tensor *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer puVar4;
  byte bVar5;
  Tensor *pTVar6;
  uchar *puVar7;
  int iVar8;
  FILE *__stream;
  size_t sVar9;
  size_t sVar10;
  uchar *puVar11;
  long __off;
  mapped_type *pmVar12;
  char *pcVar13;
  ulong __n;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint8_t dtype;
  uint8_t version [2];
  uint16_t ndim;
  uint16_t name_length;
  uint32_t n_fields;
  string name;
  uint64_t size_value;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  uint64_t offset;
  uint8_t header [12];
  byte local_f1;
  string *local_f0;
  char local_e2;
  char local_e1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  string *local_d8;
  ushort local_cc;
  ushort local_ca;
  Tensor *local_c8;
  uint local_c0;
  uint local_bc;
  key_type local_b8;
  uint local_98;
  undefined4 uStack_94;
  size_t sStack_90;
  undefined1 local_88 [16];
  pointer local_78;
  uchar *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  ulong local_50;
  size_t local_48;
  long local_3c;
  int local_34;
  
  paVar1 = &(this->m_filename).field_2;
  (this->m_fields)._M_h._M_buckets = &(this->m_fields)._M_h._M_single_bucket;
  (this->m_fields)._M_h._M_bucket_count = 1;
  (this->m_fields)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_fields)._M_h._M_element_count = 0;
  (this->m_fields)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_fields)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_fields)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_filename)._M_dataplus._M_p = (pointer)paVar1;
  local_f0 = &this->m_filename;
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_c8 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar2,pcVar2 + filename->_M_string_length);
  local_d8 = filename;
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar13 = "%s: unable to open file";
  }
  else {
    iVar8 = fseek(__stream,0,2);
    if (iVar8 == 0) {
      local_e0 = paVar1;
      sVar9 = ftell(__stream);
      pTVar6 = local_c8;
      if (sVar9 == 0xffffffffffffffff) {
        pcVar13 = "%s: Tensor: Unable to tell file cursor position.";
      }
      else {
        local_c8->m_size = sVar9;
        rewind(__stream);
        if (0x11 < pTVar6->m_size) {
          sVar10 = fread(&local_3c,1,0xc,__stream);
          if (sVar10 == 0xc) {
            sVar10 = fread(&local_e2,1,2,__stream);
            if (sVar10 == 2) {
              sVar10 = fread(&local_bc,4,1,__stream);
              if (sVar10 == 1) {
                if (local_34 == 0x656c69 && local_3c == 0x665f726f736e6574) {
                  pcVar13 = "%s: Tensor: Invalid tensor file: unknown file version.";
                  if ((local_e2 == '\x01') && (local_e1 == '\0')) {
                    local_c0 = local_bc;
                    if (local_bc != 0) {
                      uVar14 = 0;
                      do {
                        sVar10 = fread(&local_ca,2,1,__stream);
                        if (sVar10 != 1) {
                          fclose(__stream);
                          ErrorExit<std::__cxx11::string_const&>
                                    ("%s: Tensor: Unable to read &name_length.",local_d8);
                        }
                        uVar16 = (ulong)local_ca;
                        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                        std::__cxx11::string::_M_construct((ulong)&local_b8,(char)local_ca);
                        sVar10 = fread(local_b8._M_dataplus._M_p,1,uVar16,__stream);
                        if (sVar10 != uVar16) {
                          pcVar13 = "%s: Tensor: Unable to read (char *)name.data().";
LAB_003981df:
                          fclose(__stream);
                          ErrorExit<std::__cxx11::string_const&>(pcVar13,local_d8);
                        }
                        sVar10 = fread(&local_cc,2,1,__stream);
                        if (sVar10 != 1) {
                          pcVar13 = "%s: Tensor: Unable to read &ndim.";
                          goto LAB_003981df;
                        }
                        sVar10 = fread(&local_f1,1,1,__stream);
                        if (sVar10 != 1) {
                          pcVar13 = "%s: Tensor: Unable to read &dtype.";
                          goto LAB_003981df;
                        }
                        sVar10 = fread(&local_48,8,1,__stream);
                        bVar5 = local_f1;
                        if (sVar10 != 1) {
                          pcVar13 = "%s: Tensor: Unable to read &offset.";
                          goto LAB_003981df;
                        }
                        if (10 < (byte)(local_f1 - 1)) {
                          pcVar13 = "%s: Tensor: Invalid tensor file: unknown type.";
                          goto LAB_003981df;
                        }
                        __n = (ulong)local_cc;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  (&local_68,__n,(allocator_type *)&local_98);
                        uVar16 = *(ulong *)(&DAT_02cb13b8 + (long)(char)bVar5 * 8);
                        local_50 = uVar14;
                        if (__n != 0) {
                          uVar14 = 0;
                          do {
                            sVar10 = fread(&local_98,8,1,__stream);
                            if (sVar10 != 1) {
                              fclose(__stream);
                              ErrorExit<std::__cxx11::string_const&>
                                        ("%s: Tensor: Unable to read &size_value.",local_d8);
                            }
                            uVar16 = uVar16 * CONCAT44(uStack_94,local_98);
                            local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar14] =
                                 CONCAT44(uStack_94,local_98);
                            uVar14 = uVar14 + 1;
                          } while (__n != uVar14);
                        }
                        puVar11 = (uchar *)operator_new__(uVar16);
                        __off = ftell(__stream);
                        sVar9 = local_48;
                        if (__off == -1) {
                          pcVar13 = "%s: Tensor: Unable to tell current cursor position.";
LAB_0039822f:
                          fclose(__stream);
                          ErrorExit<std::__cxx11::string_const&>(pcVar13,local_d8);
                        }
                        iVar8 = fseek(__stream,local_48,0);
                        if (iVar8 == -1) {
                          pcVar13 = "%s: Tensor: Unable to seek to tensor offset.";
                          goto LAB_0039822f;
                        }
                        sVar10 = fread(puVar11,1,uVar16,__stream);
                        if (sVar10 != uVar16) {
                          pcVar13 = "%s: Tensor: Unable to read data.get().";
                          goto LAB_0039822f;
                        }
                        iVar8 = fseek(__stream,__off,0);
                        if (iVar8 == -1) {
                          pcVar13 = "%s: Tensor: Unable to seek back to current position";
                          goto LAB_0039822f;
                        }
                        local_98 = (uint)bVar5;
                        sStack_90 = sVar9;
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88
                                   ,&local_68);
                        local_70 = puVar11;
                        pmVar12 = std::__detail::
                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::Tensor::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                *)local_c8,&local_b8);
                        uVar14 = local_50;
                        *(ulong *)pmVar12 = CONCAT44(uStack_94,local_98);
                        pmVar12->offset = sStack_90;
                        puVar3 = (pmVar12->shape).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        puVar4 = (pmVar12->shape).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                        (pmVar12->shape).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
                        (pmVar12->shape).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
                        local_88 = ZEXT816(0) << 0x20;
                        (pmVar12->shape).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage = local_78;
                        local_78 = (pointer)0x0;
                        if (puVar3 != (pointer)0x0) {
                          operator_delete(puVar3,(long)puVar4 - (long)puVar3);
                        }
                        puVar7 = local_70;
                        local_70 = (uchar *)0x0;
                        puVar11 = (pmVar12->data)._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
                        (pmVar12->data)._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar7;
                        if (puVar11 != (uchar *)0x0) {
                          operator_delete__(puVar11);
                        }
                        if (local_70 != (uchar *)0x0) {
                          operator_delete__(local_70);
                        }
                        local_70 = (uchar *)0x0;
                        if ((pointer)local_88._0_8_ != (pointer)0x0) {
                          operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
                        }
                        if (local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_68.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_68.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_68.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                          operator_delete(local_b8._M_dataplus._M_p,
                                          local_b8.field_2._M_allocated_capacity + 1);
                        }
                        uVar15 = (int)uVar14 + 1;
                        uVar14 = (ulong)uVar15;
                      } while (uVar15 != local_c0);
                    }
                    fclose(__stream);
                    return;
                  }
                }
                else {
                  pcVar13 = "%s: Tensor: Invalid tensor file: invalid header.";
                }
              }
              else {
                pcVar13 = "%s: Tensor: Unable to read &n_fields.";
              }
            }
            else {
              pcVar13 = "%s: Tensor: Unable to read version.";
            }
          }
          else {
            pcVar13 = "%s: Tensor: Unable to read header.";
          }
          fclose(__stream);
          ErrorExit<std::__cxx11::string_const&>(pcVar13,local_d8);
        }
        pcVar13 = "%s: Tensor: Invalid tensor file: too small, truncated?";
      }
      fclose(__stream);
      ErrorExit<std::__cxx11::string_const&>(pcVar13,local_d8);
    }
    fclose(__stream);
    pcVar13 = "%s: Tensor: Unable to seek to end of file.";
  }
  ErrorExit<std::__cxx11::string_const&>(pcVar13,local_d8);
}

Assistant:

Tensor::Tensor(const std::string &filename) : m_filename(filename) {
    // Helpful macros to limit error-handling code duplication
#ifdef ASSERT
#undef ASSERT
#endif  // ASSERT

#define ASSERT(cond, msg)                            \
    do {                                             \
        if (!(cond)) {                               \
            fclose(file);                            \
            ErrorExit("%s: Tensor: " msg, filename); \
        }                                            \
    } while (0)

#define SAFE_READ(vars, size, count) \
    ASSERT(fread(vars, size, count, file) == (count), "Unable to read " #vars ".")

    FILE *file = fopen(filename.c_str(), "rb");
    if (file == NULL)
        ErrorExit("%s: unable to open file", filename);

    ASSERT(!fseek(file, 0, SEEK_END), "Unable to seek to end of file.");

    long size = ftell(file);
    ASSERT(size != -1, "Unable to tell file cursor position.");
    m_size = static_cast<size_t>(size);
    rewind(file);

    ASSERT(m_size >= 12 + 2 + 4, "Invalid tensor file: too small, truncated?");

    uint8_t header[12], version[2];
    uint32_t n_fields;
    SAFE_READ(header, sizeof(*header), 12);
    SAFE_READ(version, sizeof(*version), 2);
    SAFE_READ(&n_fields, sizeof(n_fields), 1);

    ASSERT(memcmp(header, "tensor_file", 12) == 0,
           "Invalid tensor file: invalid header.");
    ASSERT(version[0] == 1 && version[1] == 0,
           "Invalid tensor file: unknown file version.");

    for (uint32_t i = 0; i < n_fields; ++i) {
        uint8_t dtype;
        uint16_t name_length, ndim;
        uint64_t offset;

        SAFE_READ(&name_length, sizeof(name_length), 1);
        std::string name(name_length, '\0');
        SAFE_READ((char *)name.data(), 1, name_length);
        SAFE_READ(&ndim, sizeof(ndim), 1);
        SAFE_READ(&dtype, sizeof(dtype), 1);
        SAFE_READ(&offset, sizeof(offset), 1);
        ASSERT(dtype != Invalid && dtype <= Float64,
               "Invalid tensor file: unknown type.");

        std::vector<size_t> shape(ndim);
        size_t total_size = type_size((Type)dtype);  // no need to check here, line 43
                                                     // already removes invalid types
        for (size_t j = 0; j < (size_t)ndim; ++j) {
            uint64_t size_value;
            SAFE_READ(&size_value, sizeof(size_value), 1);
            shape[j] = (size_t)size_value;
            total_size *= shape[j];
        }

        auto data = std::unique_ptr<uint8_t[]>(new uint8_t[total_size]);

        long cur_pos = ftell(file);
        ASSERT(cur_pos != -1, "Unable to tell current cursor position.");
        ASSERT(fseek(file, offset, SEEK_SET) != -1, "Unable to seek to tensor offset.");
        SAFE_READ(data.get(), 1, total_size);
        ASSERT(fseek(file, cur_pos, SEEK_SET) != -1,
               "Unable to seek back to current position");

        m_fields[name] =
            Field{(Type)dtype, static_cast<size_t>(offset), shape, std::move(data)};
    }

    fclose(file);

#undef SAFE_READ
#undef ASSERT
}